

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlRegCheckCharacter(xmlRegAtomPtr atom,int codepoint)

{
  xmlRegRangePtr pxVar1;
  int iVar2;
  uint local_34;
  int accept;
  xmlRegRangePtr range;
  int local_20;
  int ret;
  int i;
  int codepoint_local;
  xmlRegAtomPtr atom_local;
  
  range._4_4_ = 0;
  if (atom == (xmlRegAtomPtr)0x0) {
LAB_001b88a1:
    atom_local._4_4_ = 0xffffffff;
  }
  else {
    if (codepoint < 0x100) {
      if (((codepoint < 9) || (10 < codepoint)) && ((codepoint != 0xd && (codepoint < 0x20))))
      goto LAB_001b88a1;
    }
    else if ((((codepoint < 0x100) || (0xd7ff < codepoint)) &&
             ((codepoint < 0xe000 || (0xfffd < codepoint)))) &&
            ((codepoint < 0x10000 || (0x10ffff < codepoint)))) goto LAB_001b88a1;
    switch(atom->type) {
    case XML_REGEXP_EPSILON:
    case XML_REGEXP_SUBREG:
      atom_local._4_4_ = 0xffffffff;
      break;
    case XML_REGEXP_CHARVAL:
      atom_local._4_4_ = (uint)(codepoint == atom->codepoint);
      break;
    case XML_REGEXP_RANGES:
      local_34 = 0;
      for (local_20 = 0; local_20 < atom->nbRanges; local_20 = local_20 + 1) {
        pxVar1 = atom->ranges[local_20];
        if (pxVar1->neg == 2) {
          iVar2 = xmlRegCheckCharacterRange
                            (pxVar1->type,codepoint,0,pxVar1->start,pxVar1->end,pxVar1->blockName);
          if (iVar2 != 0) {
            return 0;
          }
        }
        else if (pxVar1->neg == 0) {
          iVar2 = xmlRegCheckCharacterRange
                            (pxVar1->type,codepoint,0,pxVar1->start,pxVar1->end,pxVar1->blockName);
          if (iVar2 != 0) {
            local_34 = 1;
          }
        }
        else {
          iVar2 = xmlRegCheckCharacterRange
                            (pxVar1->type,codepoint,0,pxVar1->start,pxVar1->end,pxVar1->blockName);
          if (iVar2 != 0) {
            return 0;
          }
          local_34 = 1;
        }
      }
      atom_local._4_4_ = local_34;
      break;
    case XML_REGEXP_STRING:
      atom_local._4_4_ = 0xffffffff;
      break;
    case XML_REGEXP_ANYCHAR:
    case XML_REGEXP_ANYSPACE:
    case XML_REGEXP_NOTSPACE:
    case XML_REGEXP_INITNAME:
    case XML_REGEXP_NOTINITNAME:
    case XML_REGEXP_NAMECHAR:
    case XML_REGEXP_NOTNAMECHAR:
    case XML_REGEXP_DECIMAL:
    case XML_REGEXP_NOTDECIMAL:
    case XML_REGEXP_REALCHAR:
    case XML_REGEXP_NOTREALCHAR:
    case XML_REGEXP_LETTER:
    case XML_REGEXP_LETTER_UPPERCASE:
    case XML_REGEXP_LETTER_LOWERCASE:
    case XML_REGEXP_LETTER_TITLECASE:
    case XML_REGEXP_LETTER_MODIFIER:
    case XML_REGEXP_LETTER_OTHERS:
    case XML_REGEXP_MARK:
    case XML_REGEXP_MARK_NONSPACING:
    case XML_REGEXP_MARK_SPACECOMBINING:
    case XML_REGEXP_MARK_ENCLOSING:
    case XML_REGEXP_NUMBER:
    case XML_REGEXP_NUMBER_DECIMAL:
    case XML_REGEXP_NUMBER_LETTER:
    case XML_REGEXP_NUMBER_OTHERS:
    case XML_REGEXP_PUNCT:
    case XML_REGEXP_PUNCT_CONNECTOR:
    case XML_REGEXP_PUNCT_DASH:
    case XML_REGEXP_PUNCT_OPEN:
    case XML_REGEXP_PUNCT_CLOSE:
    case XML_REGEXP_PUNCT_INITQUOTE:
    case XML_REGEXP_PUNCT_FINQUOTE:
    case XML_REGEXP_PUNCT_OTHERS:
    case XML_REGEXP_SEPAR:
    case XML_REGEXP_SEPAR_SPACE:
    case XML_REGEXP_SEPAR_LINE:
    case XML_REGEXP_SEPAR_PARA:
    case XML_REGEXP_SYMBOL:
    case XML_REGEXP_SYMBOL_MATH:
    case XML_REGEXP_SYMBOL_CURRENCY:
    case XML_REGEXP_SYMBOL_MODIFIER:
    case XML_REGEXP_SYMBOL_OTHERS:
    case XML_REGEXP_OTHER:
    case XML_REGEXP_OTHER_CONTROL:
    case XML_REGEXP_OTHER_FORMAT:
    case XML_REGEXP_OTHER_PRIVATE:
    case XML_REGEXP_OTHER_NA:
    case XML_REGEXP_BLOCK_NAME:
      range._4_4_ = xmlRegCheckCharacterRange(atom->type,codepoint,0,0,0,(xmlChar *)atom->valuep);
      if (atom->neg != 0) {
        range._4_4_ = (uint)((range._4_4_ != 0 ^ 0xffU) & 1);
      }
    default:
      atom_local._4_4_ = range._4_4_;
    }
  }
  return atom_local._4_4_;
}

Assistant:

static int
xmlRegCheckCharacter(xmlRegAtomPtr atom, int codepoint) {
    int i, ret = 0;
    xmlRegRangePtr range;

    if ((atom == NULL) || (!IS_CHAR(codepoint)))
	return(-1);

    switch (atom->type) {
        case XML_REGEXP_SUBREG:
        case XML_REGEXP_EPSILON:
	    return(-1);
        case XML_REGEXP_CHARVAL:
            return(codepoint == atom->codepoint);
        case XML_REGEXP_RANGES: {
	    int accept = 0;

	    for (i = 0;i < atom->nbRanges;i++) {
		range = atom->ranges[i];
		if (range->neg == 2) {
		    ret = xmlRegCheckCharacterRange(range->type, codepoint,
						0, range->start, range->end,
						range->blockName);
		    if (ret != 0)
			return(0); /* excluded char */
		} else if (range->neg) {
		    ret = xmlRegCheckCharacterRange(range->type, codepoint,
						0, range->start, range->end,
						range->blockName);
		    if (ret == 0)
		        accept = 1;
		    else
		        return(0);
		} else {
		    ret = xmlRegCheckCharacterRange(range->type, codepoint,
						0, range->start, range->end,
						range->blockName);
		    if (ret != 0)
			accept = 1; /* might still be excluded */
		}
	    }
	    return(accept);
	}
        case XML_REGEXP_STRING:
	    return(-1);
        case XML_REGEXP_ANYCHAR:
        case XML_REGEXP_ANYSPACE:
        case XML_REGEXP_NOTSPACE:
        case XML_REGEXP_INITNAME:
        case XML_REGEXP_NOTINITNAME:
        case XML_REGEXP_NAMECHAR:
        case XML_REGEXP_NOTNAMECHAR:
        case XML_REGEXP_DECIMAL:
        case XML_REGEXP_NOTDECIMAL:
        case XML_REGEXP_REALCHAR:
        case XML_REGEXP_NOTREALCHAR:
        case XML_REGEXP_LETTER:
        case XML_REGEXP_LETTER_UPPERCASE:
        case XML_REGEXP_LETTER_LOWERCASE:
        case XML_REGEXP_LETTER_TITLECASE:
        case XML_REGEXP_LETTER_MODIFIER:
        case XML_REGEXP_LETTER_OTHERS:
        case XML_REGEXP_MARK:
        case XML_REGEXP_MARK_NONSPACING:
        case XML_REGEXP_MARK_SPACECOMBINING:
        case XML_REGEXP_MARK_ENCLOSING:
        case XML_REGEXP_NUMBER:
        case XML_REGEXP_NUMBER_DECIMAL:
        case XML_REGEXP_NUMBER_LETTER:
        case XML_REGEXP_NUMBER_OTHERS:
        case XML_REGEXP_PUNCT:
        case XML_REGEXP_PUNCT_CONNECTOR:
        case XML_REGEXP_PUNCT_DASH:
        case XML_REGEXP_PUNCT_OPEN:
        case XML_REGEXP_PUNCT_CLOSE:
        case XML_REGEXP_PUNCT_INITQUOTE:
        case XML_REGEXP_PUNCT_FINQUOTE:
        case XML_REGEXP_PUNCT_OTHERS:
        case XML_REGEXP_SEPAR:
        case XML_REGEXP_SEPAR_SPACE:
        case XML_REGEXP_SEPAR_LINE:
        case XML_REGEXP_SEPAR_PARA:
        case XML_REGEXP_SYMBOL:
        case XML_REGEXP_SYMBOL_MATH:
        case XML_REGEXP_SYMBOL_CURRENCY:
        case XML_REGEXP_SYMBOL_MODIFIER:
        case XML_REGEXP_SYMBOL_OTHERS:
        case XML_REGEXP_OTHER:
        case XML_REGEXP_OTHER_CONTROL:
        case XML_REGEXP_OTHER_FORMAT:
        case XML_REGEXP_OTHER_PRIVATE:
        case XML_REGEXP_OTHER_NA:
	case XML_REGEXP_BLOCK_NAME:
	    ret = xmlRegCheckCharacterRange(atom->type, codepoint, 0, 0, 0,
		                            (const xmlChar *)atom->valuep);
	    if (atom->neg)
		ret = !ret;
	    break;
    }
    return(ret);
}